

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

bool __thiscall
ON_SubDEdge::HasInteriorEdgeTopology(ON_SubDEdge *this,bool bRequireOppositeFaceDirections)

{
  ulong uVar1;
  ulong uVar2;
  ON_SubDEdgePtr OVar3;
  ON_SubDEdgePtr OVar4;
  char *sFormat;
  int line_number;
  ON_SubDFace *this_00;
  ON_SubDFace *this_01;
  
  if ((this->m_face_count == 2) &&
     ((!bRequireOppositeFaceDirections ||
      ((((uint)this->m_face2[1].m_ptr ^ (uint)this->m_face2[0].m_ptr) & 1) != 0)))) {
    uVar1 = this->m_face2[0].m_ptr;
    this_00 = (ON_SubDFace *)(uVar1 & 0xfffffffffffffff8);
    if (this_00 != (ON_SubDFace *)0x0) {
      uVar2 = this->m_face2[1].m_ptr;
      this_01 = (ON_SubDFace *)(uVar2 & 0xfffffffffffffff8);
      if ((this_01 != (ON_SubDFace *)0x0) && (this_00 != this_01)) {
        OVar3 = ON_SubDFace::EdgePtrFromEdge(this_00,this);
        OVar4 = ON_SubDFace::EdgePtrFromEdge(this_01,this);
        if ((ON_SubDEdge *)(OVar3.m_ptr & 0xfffffffffffffff8) == this) {
          if ((((uint)OVar3.m_ptr ^ (uint)uVar1) & 1) == 0) {
            if ((ON_SubDEdge *)(OVar4.m_ptr & 0xfffffffffffffff8) == this) {
              if ((((uint)OVar4.m_ptr ^ (uint)uVar2) & 1) == 0) {
                if ((this->m_vertex[0] != (ON_SubDVertex *)0x0) &&
                   (this->m_vertex[1] != (ON_SubDVertex *)0x0 &&
                    this->m_vertex[0] != this->m_vertex[1])) {
                  return true;
                }
                ON_SubDIncrementErrorCount();
                sFormat = "m_vertex[] has null or invalid pointers.";
                line_number = 0x19d7;
              }
              else {
                ON_SubDIncrementErrorCount();
                sFormat = "m_face2[1] has inconsistent direction flags.";
                line_number = 0x19d2;
              }
            }
            else {
              ON_SubDIncrementErrorCount();
              sFormat = "m_face2[1] does not reference this edge.";
              line_number = 0x19cd;
            }
          }
          else {
            ON_SubDIncrementErrorCount();
            sFormat = "m_face2[0] has inconsistent direction flags.";
            line_number = 0x19c8;
          }
        }
        else {
          ON_SubDIncrementErrorCount();
          sFormat = "m_face2[0] does not reference this edge.";
          line_number = 0x19c3;
        }
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd.cpp"
                   ,line_number,"",sFormat);
      }
    }
  }
  return false;
}

Assistant:

bool ON_SubDEdge::HasInteriorEdgeTopology(bool bRequireOppositeFaceDirections) const
{
  for (;;)
  {
    if (2 != m_face_count)
      break;
    if (bRequireOppositeFaceDirections && ON_SUBD_FACE_DIRECTION(m_face2[0].m_ptr) == ON_SUBD_FACE_DIRECTION(m_face2[1].m_ptr))
      break;
    const ON_SubDFace* f[2] = { ON_SUBD_FACE_POINTER(m_face2[0].m_ptr), ON_SUBD_FACE_POINTER(m_face2[1].m_ptr) };
    if ( nullptr == f[0] || nullptr == f[1] || f[0] == f[1])
      break;
    const ON_SubDEdgePtr feptr[2] = { f[0]->EdgePtrFromEdge(this), f[1]->EdgePtrFromEdge(this) };
    if (this != ON_SUBD_EDGE_POINTER(feptr[0].m_ptr))
    {
      ON_SUBD_ERROR("m_face2[0] does not reference this edge.");
      break;
    }
    if (ON_SUBD_FACE_DIRECTION(feptr[0].m_ptr) != ON_SUBD_FACE_DIRECTION(m_face2[0].m_ptr))
    {
      ON_SUBD_ERROR("m_face2[0] has inconsistent direction flags.");
      break;
    }
    if (this != ON_SUBD_EDGE_POINTER(feptr[1].m_ptr))
    {
      ON_SUBD_ERROR("m_face2[1] does not reference this edge.");
      break;
    }
    if (ON_SUBD_FACE_DIRECTION(feptr[1].m_ptr) != ON_SUBD_FACE_DIRECTION(m_face2[1].m_ptr))
    {
      ON_SUBD_ERROR("m_face2[1] has inconsistent direction flags.");
      break;
    }
    if (nullptr == m_vertex[0] || nullptr == m_vertex[1] || m_vertex[0] == m_vertex[1])
    {
      ON_SUBD_ERROR("m_vertex[] has null or invalid pointers.");
      break;
    }
    return true;
  }
  return false;
}